

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

Pattern * __thiscall OrPattern::doAnd(OrPattern *this,Pattern *b,int4 sa)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  OrPattern *this_00;
  pointer ppDVar3;
  undefined8 *puVar4;
  DisjointPattern *tmp;
  vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> newlist;
  
  if (b != (Pattern *)0x0) {
    lVar2 = __dynamic_cast(b,&Pattern::typeinfo,&typeinfo,0);
    newlist.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    newlist.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    newlist.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (lVar2 != 0) {
      for (ppDVar3 = (this->orlist).
                     super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppDVar3 !=
          (this->orlist).super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppDVar3 = ppDVar3 + 1) {
        for (puVar4 = *(undefined8 **)(lVar2 + 8); puVar4 != *(undefined8 **)(lVar2 + 0x10);
            puVar4 = puVar4 + 1) {
          iVar1 = (*((*ppDVar3)->super_Pattern)._vptr_Pattern[5])(*ppDVar3,*puVar4,(ulong)(uint)sa);
          tmp = (DisjointPattern *)CONCAT44(extraout_var,iVar1);
          std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::push_back
                    (&newlist,&tmp);
        }
      }
      goto LAB_003513fb;
    }
  }
  newlist.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  newlist.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  newlist.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  for (ppDVar3 = (this->orlist).
                 super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppDVar3 !=
      (this->orlist).super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppDVar3 = ppDVar3 + 1) {
    iVar1 = (*((*ppDVar3)->super_Pattern)._vptr_Pattern[5])(*ppDVar3,b,(ulong)(uint)sa);
    tmp = (DisjointPattern *)CONCAT44(extraout_var_00,iVar1);
    std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::push_back(&newlist,&tmp);
  }
LAB_003513fb:
  this_00 = (OrPattern *)operator_new(0x20);
  OrPattern(this_00,&newlist);
  std::_Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::~_Vector_base
            (&newlist.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>);
  return &this_00->super_Pattern;
}

Assistant:

Pattern *OrPattern::doAnd(const Pattern *b,int4 sa) const

{
  const OrPattern *b2 = dynamic_cast<const OrPattern *>(b);
  vector<DisjointPattern *> newlist;
  vector<DisjointPattern *>::const_iterator iter,iter2;
  DisjointPattern *tmp;
  OrPattern *tmpor;

  if (b2 == (const OrPattern *)0) {
    for(iter=orlist.begin();iter!=orlist.end();++iter) {
      tmp = (DisjointPattern *)(*iter)->doAnd(b,sa);
      newlist.push_back(tmp);
    }
  }
  else {
    for(iter=orlist.begin();iter!=orlist.end();++iter)
      for(iter2=b2->orlist.begin();iter2!=b2->orlist.end();++iter2) {
	tmp = (DisjointPattern *)(*iter)->doAnd(*iter2,sa);
	newlist.push_back(tmp);
      }
  }
  tmpor = new OrPattern(newlist);
  return tmpor;
}